

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

int SSL_CTX_set1_requested_trust_anchors(SSL_CTX *ctx,uint8_t *ids,size_t ids_len)

{
  Span<const_unsigned_char> in;
  bool bVar1;
  size_t extraout_RDX;
  Span<const_unsigned_char> in_00;
  undefined1 local_58 [8];
  Array<unsigned_char> copy;
  undefined1 auStack_38 [8];
  Span<const_unsigned_char> span;
  size_t ids_len_local;
  uint8_t *ids_local;
  SSL_CTX *ctx_local;
  
  span.size_ = ids_len;
  bssl::Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)auStack_38,ids,ids_len);
  copy.size_ = (size_t)auStack_38;
  in_00.size_ = extraout_RDX;
  in_00.data_ = span.data_;
  bVar1 = bssl::ssl_is_valid_trust_anchor_list((bssl *)auStack_38,in_00);
  if (bVar1) {
    bssl::Array<unsigned_char>::Array((Array<unsigned_char> *)local_58);
    in.size_ = (size_t)span.data_;
    in.data_ = (uchar *)auStack_38;
    bVar1 = bssl::Array<unsigned_char>::CopyFrom((Array<unsigned_char> *)local_58,in);
    if (bVar1) {
      std::optional<bssl::Array<unsigned_char>>::operator=
                ((optional<bssl::Array<unsigned_char>> *)&ctx->requested_trust_anchors,
                 (Array<unsigned_char> *)local_58);
    }
    ctx_local._4_4_ = (uint)bVar1;
    bssl::Array<unsigned_char>::~Array((Array<unsigned_char> *)local_58);
  }
  else {
    ERR_put_error(0x10,0,0x148,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                  ,0xd58);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int SSL_CTX_set1_requested_trust_anchors(SSL_CTX *ctx, const uint8_t *ids,
                                         size_t ids_len) {
  auto span = Span(ids, ids_len);
  if (!ssl_is_valid_trust_anchor_list(span)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_TRUST_ANCHOR_LIST);
    return 0;
  }
  Array<uint8_t> copy;
  if (!copy.CopyFrom(span)) {
    return 0;
  }
  ctx->requested_trust_anchors = std::move(copy);
  return 1;
}